

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::print(Board *this)

{
  uint uVar1;
  const_reference pvVar2;
  ostream *poVar3;
  char local_71;
  allocator local_49;
  string local_48 [39];
  char local_21;
  TileValue TStack_20;
  char value;
  value_type tile;
  column c;
  row r;
  Board *this_local;
  
  for (tile.status = Empty; tile.status < this->SIZE; tile.status = tile.status + Solved) {
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    for (tile.value = Empty; tile.value < this->SIZE; tile.value = tile.value + One) {
      uVar1 = translate(this,&tile.value,&tile.status,&this->SIZE);
      pvVar2 = std::vector<Tile,_std::allocator<Tile>_>::operator[](&this->_tiles,(ulong)uVar1);
      _TStack_20 = *pvVar2;
      if (TStack_20 == Empty) {
        local_71 = '-';
      }
      else {
        local_71 = (char)TStack_20 + '0';
      }
      local_21 = local_71;
      poVar3 = std::operator<<((ostream *)&std::cout,"  ");
      poVar3 = std::operator<<(poVar3,local_21);
      std::operator<<(poVar3," ");
      if (((tile.value + One) % this->SQUARE_SIZE == 0) && (tile.value != this->SIZE - One)) {
        std::operator<<((ostream *)&std::cout,"|");
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    if (((tile.status + Solved) % this->SQUARE_SIZE == 0) && (tile.status != this->SIZE - Solved)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,0x26,'_',&local_49);
      poVar3 = std::operator<<((ostream *)&std::cout,local_48);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  return;
}

Assistant:

void Board::print() const
{
	for (row r = 0; r < Board::SIZE; r++)
	{
		std::cout << std::endl;

		for (column c = 0; c < Board::SIZE; c++)
		{
			auto tile = _tiles[translate(c, r, Board::SIZE)];
			auto value = tile.value == TileValue::Empty ? '-' : static_cast<char>((int)tile.value + 48);

			std::cout << "  " << value << " ";

			if ((c + 1) % Board::SQUARE_SIZE == 0 && c != Board::SIZE - 1)
				std::cout << "|";
		}

		std::cout << std::endl;

		if ((r + 1) % Board::SQUARE_SIZE == 0 && r != Board::SIZE - 1)
		{
			std::cout << std::string(38, '_') << std::endl;
		}
	}

}